

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void autoIncrementEnd(Parse *pParse)

{
  int iVar1;
  int p3;
  sqlite3 *psVar2;
  Vdbe *p;
  Db *pDVar3;
  byte bVar4;
  VdbeOp *pVVar5;
  Table *pTab;
  AutoincInfo *pAVar6;
  int iVar7;
  
  psVar2 = pParse->db;
  p = pParse->pVdbe;
  pAVar6 = (AutoincInfo *)&pParse->pAinc;
  while( true ) {
    pAVar6 = pAVar6->pNext;
    if (pAVar6 == (AutoincInfo *)0x0) {
      return;
    }
    pDVar3 = psVar2->aDb;
    iVar1 = pAVar6->iDb;
    p3 = pAVar6->regCtr;
    if (pParse->nTempReg == '\0') {
      iVar7 = pParse->nMem + 1;
      pParse->nMem = iVar7;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar7 = pParse->aTempReg[bVar4];
    }
    sqlite3VdbeAddOp3(p,0x37,p3 + 2,p->nOp + 7,p3);
    pTab = (pDVar3[iVar1].pSchema)->pSeqTab;
    sqlite3OpenTable(pParse,0,pAVar6->iDb,pTab,0x71);
    pVVar5 = sqlite3VdbeAddOpList(p,5,autoIncrementEnd::autoIncEnd,(int)pTab);
    if (pVVar5 == (VdbeOp *)0x0) break;
    iVar1 = p3 + 1;
    pVVar5->p1 = iVar1;
    pVVar5[1].p2 = iVar1;
    pVVar5[2].p1 = p3 + -1;
    pVVar5[2].p3 = iVar7;
    pVVar5[3].p2 = iVar7;
    pVVar5[3].p3 = iVar1;
    pVVar5[3].p5 = 8;
    if (iVar7 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar7;
      }
    }
    if (pVVar5 == (VdbeOp *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void autoIncrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    static const int iLn = VDBE_OFFSET_LINENO(2);
    static const VdbeOpList autoIncEnd[] = {
      /* 0 */ {OP_NotNull,     0, 2, 0},
      /* 1 */ {OP_NewRowid,    0, 0, 0},
      /* 2 */ {OP_MakeRecord,  0, 2, 0},
      /* 3 */ {OP_Insert,      0, 0, 0},
      /* 4 */ {OP_Close,       0, 0, 0}
    };
    VdbeOp *aOp;
    Db *pDb = &db->aDb[p->iDb];
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3VdbeAddOp3(v, OP_Le, memId+2, sqlite3VdbeCurrentAddr(v)+7, memId);
    VdbeCoverage(v);
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    aOp = sqlite3VdbeAddOpList(v, ArraySize(autoIncEnd), autoIncEnd, iLn);
    if( aOp==0 ) break;
    aOp[0].p1 = memId+1;
    aOp[1].p2 = memId+1;
    aOp[2].p1 = memId-1;
    aOp[2].p3 = iRec;
    aOp[3].p2 = iRec;
    aOp[3].p3 = memId+1;
    aOp[3].p5 = OPFLAG_APPEND;
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}